

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O1

void __thiscall
OpenMPVariantClause::addConstructDirective
          (OpenMPVariantClause *this,char *_score,OpenMPDirective *_construct_directive)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,_score,&local_69);
  paVar1 = &local_48.first.field_2;
  if (local_68 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_58) {
    local_48.first.field_2._8_8_ = uStack_50;
    local_48.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_48.first.field_2._M_allocated_capacity._1_7_ = uStack_57;
  local_48.first.field_2._M_local_buf[0] = local_58;
  local_48.first._M_string_length = local_60;
  local_60 = 0;
  local_58 = '\0';
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_58;
  local_48.second = _construct_directive;
  std::
  vector<std::pair<std::__cxx11::string,OpenMPDirective*>,std::allocator<std::pair<std::__cxx11::string,OpenMPDirective*>>>
  ::emplace_back<std::pair<std::__cxx11::string,OpenMPDirective*>>
            ((vector<std::pair<std::__cxx11::string,OpenMPDirective*>,std::allocator<std::pair<std::__cxx11::string,OpenMPDirective*>>>
              *)&this->construct_directives,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_68 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

std::pair<std::string, std::string>* getArchExpression() { return &arch_expression; }